

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O0

int download(char *url,char *save_path)

{
  int iVar1;
  FILE *pFVar2;
  time_t tVar3;
  float fVar4;
  char local_828 [8];
  char tmp [2048];
  http_t *info;
  char *save_path_local;
  char *url_local;
  
  tmp[0x7f8] = '\0';
  tmp[0x7f9] = '\0';
  tmp[0x7fa] = '\0';
  tmp[0x7fb] = '\0';
  tmp[0x7fc] = '\0';
  tmp[0x7fd] = '\0';
  tmp[0x7fe] = '\0';
  tmp[0x7ff] = '\0';
  memset(local_828,0,0x800);
  if ((url == (char *)0x0) || (save_path == (char *)0x0)) {
    url_local._4_4_ = -1;
  }
  else {
    tmp._2040_8_ = malloc(0x3148);
    if ((void *)tmp._2040_8_ == (void *)0x0) {
      if ((print_level & 4U) != 0) {
        printf("[%s][%s(%d)]:malloc failed\n","MSG_ERROR","download",0x1e5);
      }
      url_local._4_4_ = -1;
    }
    else {
      memset((void *)tmp._2040_8_,0,0x3148);
      *(undefined4 *)tmp._2040_8_ = 0xffffffff;
      *(char **)(tmp._2040_8_ + 0x3120) = save_path;
      iVar1 = parser_URL(url,(http_t *)tmp._2040_8_);
      if (iVar1 == -1) {
        clean_up((http_t *)tmp._2040_8_);
        url_local._4_4_ = -1;
      }
      else {
        iVar1 = connect_server((http_t *)tmp._2040_8_);
        if (iVar1 == -1) {
          clean_up((http_t *)tmp._2040_8_);
          url_local._4_4_ = -1;
        }
        else {
          iVar1 = send_request((http_t *)tmp._2040_8_);
          if (iVar1 == -1) {
            clean_up((http_t *)tmp._2040_8_);
            url_local._4_4_ = -1;
          }
          else {
            pFVar2 = fdopen(*(int *)tmp._2040_8_,"r");
            *(FILE **)(tmp._2040_8_ + 8) = pFVar2;
            if (*(long *)(tmp._2040_8_ + 8) == 0) {
              if ((print_level & 4U) != 0) {
                printf("[%s][%s(%d)]:fdopen error\n","MSG_ERROR","download",0x201);
              }
              clean_up((http_t *)tmp._2040_8_);
              url_local._4_4_ = -1;
            }
            else {
              iVar1 = parse_http_header((http_t *)tmp._2040_8_);
              if (iVar1 == -1) {
                clean_up((http_t *)tmp._2040_8_);
                url_local._4_4_ = -1;
              }
              else if (*(int *)(tmp._2040_8_ + 0x2914) == 200) {
                if ((print_level & 1U) != 0) {
                  printf("[%s][%s(%d)]:recv data now\n","MSG_DEBUG","download",0x20c);
                }
                tVar3 = time((time_t *)0x0);
                *(time_t *)(tmp._2040_8_ + 0x3138) = tVar3;
                iVar1 = recv_response((http_t *)tmp._2040_8_);
                if (iVar1 == -1) {
                  clean_up((http_t *)tmp._2040_8_);
                  url_local._4_4_ = -1;
                }
                else {
                  tVar3 = time((time_t *)0x0);
                  *(time_t *)(tmp._2040_8_ + 0x3140) = tVar3;
                  if ((print_level & 2U) != 0) {
                    printf("[%s][%s(%d)]:recv %d bytes\n","MSG_INFO","download",0x214,
                           (ulong)*(uint *)(tmp._2040_8_ + 0x3130));
                  }
                  if ((print_level & 2U) != 0) {
                    fVar4 = calc_download_speed((http_t *)tmp._2040_8_);
                    printf("[%s][%s(%d)]:Average download speed: %.2fKB/s\n",
                           (double)(fVar4 / 1000.0),"MSG_INFO","download",0x216);
                  }
                  clean_up((http_t *)tmp._2040_8_);
                  url_local._4_4_ = 0;
                }
              }
              else if (*(int *)(tmp._2040_8_ + 0x2914) == 0x12e) {
                if ((print_level & 2U) != 0) {
                  printf("[%s][%s(%d)]:redirect: %s\n","MSG_INFO","download",0x218,
                         tmp._2040_8_ + 0x2920);
                }
                strncpy(local_828,(char *)(tmp._2040_8_ + 0x2920),0x7ff);
                clean_up((http_t *)tmp._2040_8_);
                url_local._4_4_ = download(local_828,save_path);
              }
              else if (*(int *)(tmp._2040_8_ + 0x2914) == 0x194) {
                if ((print_level & 4U) != 0) {
                  printf("[%s][%s(%d)]:Page not found\n","MSG_ERROR","download",0x21d);
                }
                clean_up((http_t *)tmp._2040_8_);
                url_local._4_4_ = -1;
              }
              else {
                if ((print_level & 2U) != 0) {
                  printf("[%s][%s(%d)]:Not supported http code %d\n","MSG_INFO","download",0x221,
                         (ulong)*(uint *)(tmp._2040_8_ + 0x2914));
                }
                clean_up((http_t *)tmp._2040_8_);
                url_local._4_4_ = -1;
              }
            }
          }
        }
      }
    }
  }
  return url_local._4_4_;
}

Assistant:

int download(const char *url, const char *save_path) {
  http_t *info = NULL;
  char tmp[URI_MAX_LEN] = {0};

  if (!url || !save_path) return -1;

  // Initialization structure
  info = (http_t *)malloc(sizeof(http_t));
  if (!info) {
    lprintf(MSG_ERROR, "malloc failed\n");
    return -1;
  }
  memset(info, 0x0, sizeof(http_t));
  info->sock = -1;
  info->save_path = (char *)save_path;

  // resolve url
  if (-1 == parser_URL((char *)url, info)) {
    clean_up(info);
    return -1;
  }

  // Connect to server
  if (-1 == connect_server(info)) {
    clean_up(info);
    return -1;
  }

  // Send HTTP request message
  if (-1 == send_request(info)) {
    clean_up(info);
    return -1;
  }

  // Receiving the header information of the response
  info->in = fdopen(info->sock, "r");
  if (!info->in) {
    lprintf(MSG_ERROR, "fdopen error\n");
    clean_up(info);
    return -1;
  }

  // Analytical Head
  if (-1 == parse_http_header(info)) {
    clean_up(info);
    return -1;
  }
  if (info->status_code == HTTP_OK) {
    lprintf(MSG_DEBUG, "recv data now\n");
    info->start_recv_time = time(0);
    if (-1 == recv_response(info)) {
      clean_up(info);
      return -1;
    }

    info->end_recv_time = time(0);
    lprintf(MSG_INFO, "recv %d bytes\n", info->recv_data_len);
    lprintf(MSG_INFO, "Average download speed: %.2fKB/s\n",
            calc_download_speed(info) / 1000);
  } else if (info->status_code == HTTP_REDIRECT) {
    lprintf(MSG_INFO, "redirect: %s\n", info->location);
    strncpy(tmp, info->location, URI_MAX_LEN - 1);
    clean_up(info);
    return download(tmp, save_path);
  } else if (info->status_code == HTTP_NOT_FOUND) {
    lprintf(MSG_ERROR, "Page not found\n");
    clean_up(info);
    return -1;
  } else {
    lprintf(MSG_INFO, "Not supported http code %d\n", info->status_code);
    clean_up(info);
    return -1;
  }

  clean_up(info);
  return 0;
}